

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *ctx,int is_enc,void *key,size_t key_size)

{
  ulong uVar1;
  ulong in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  __m128i temp;
  __m128i temp_00;
  __m128i temp_01;
  __m128i temp_02;
  __m128i temp_03;
  __m128i temp_04;
  __m128i temp_05;
  __m128i temp_06;
  __m128i temp_07;
  __m128i temp_08;
  __m128i temp_09;
  __m128i temp_10;
  __m128i temp_11;
  __m128i temp_12;
  __m128i temp_13;
  __m128i temp_14;
  __m128i temp_15;
  __m128i temp_16;
  __m128i temp_17;
  __m128i temp_18;
  __m128i key_00;
  __m128i key_01;
  __m128i key_02;
  __m128i key_03;
  __m128i key_04;
  __m128i key_05;
  __m128i key_06;
  __m128i key_07;
  __m128i key_08;
  __m128i key_09;
  __m128i key_10;
  __m128i key_11;
  __m128i key_12;
  __m128i key_13;
  __m128i key_14;
  __m128i key_15;
  __m128i key_16;
  __m128i key_17;
  __m128i key_18;
  __m128i key_19;
  size_t i;
  ulong local_38;
  undefined8 *puVar2;
  
  if (in_ESI == 0) {
    __assert_fail("is_enc && \"decryption is not supported (yet)\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/fusion.c"
                  ,0x2af,
                  "void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *, int, const void *, size_t)"
                 );
  }
  if (in_RCX == 0x10) {
    *(undefined4 *)(in_RDI + 0x1e) = 10;
  }
  else {
    if (in_RCX != 0x20) {
      __assert_fail("!\"invalid key size; AES128 / AES256 are supported\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/fusion.c"
                    ,699,
                    "void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *, int, const void *, size_t)"
                   );
    }
    *(undefined4 *)(in_RDI + 0x1e) = 0xe;
  }
  uVar3 = in_RDX[1];
  local_38 = 1;
  *in_RDI = *in_RDX;
  in_RDI[1] = uVar3;
  if (in_RCX == 0x20) {
    uVar3 = in_RDX[3];
    local_38 = 2;
    in_RDI[2] = in_RDX[2];
    in_RDI[3] = uVar3;
  }
  key_00[1] = in_RCX >> 4;
  temp[0] = (local_38 - key_00[1]) * 0x10;
  uVar3 = in_RDI[(local_38 - key_00[1]) * 2];
  uVar4 = (in_RDI + (local_38 - key_00[1]) * 2)[1];
  auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),1);
  vpshufd_avx(auVar5,0xff);
  temp[1] = (longlong)in_RDI;
  key_00[0] = (longlong)in_RDI;
  puVar2 = in_RDI;
  expand_key(key_00,temp);
  in_RDI[local_38 * 2] = uVar3;
  (in_RDI + local_38 * 2)[1] = uVar4;
  uVar1 = local_38;
  if (local_38 != *(uint *)(in_RDI + 0x1e)) {
    uVar1 = local_38 + 1;
    if (0x18 < in_RCX) {
      key_01[1] = in_RCX >> 4;
      temp_00[0] = (uVar1 - key_01[1]) * 0x10;
      uVar3 = in_RDI[(uVar1 - key_01[1]) * 2];
      uVar4 = (in_RDI + (uVar1 - key_01[1]) * 2)[1];
      auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),1);
      vpshufd_avx(auVar5,0xaa);
      temp_00[1] = (longlong)in_RDI;
      key_01[0] = (longlong)puVar2;
      expand_key(key_01,temp_00);
      in_RDI[uVar1 * 2] = uVar3;
      (in_RDI + uVar1 * 2)[1] = uVar4;
      uVar1 = local_38 + 2;
    }
    local_38 = uVar1;
    key_02[1] = in_RCX >> 4;
    temp_01[0] = (local_38 - key_02[1]) * 0x10;
    uVar3 = in_RDI[(local_38 - key_02[1]) * 2];
    uVar4 = (in_RDI + (local_38 - key_02[1]) * 2)[1];
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),2);
    vpshufd_avx(auVar5,0xff);
    temp_01[1] = (longlong)in_RDI;
    key_02[0] = (longlong)puVar2;
    expand_key(key_02,temp_01);
    in_RDI[local_38 * 2] = uVar3;
    (in_RDI + local_38 * 2)[1] = uVar4;
    uVar1 = local_38;
    if (local_38 != *(uint *)(in_RDI + 0x1e)) {
      uVar1 = local_38 + 1;
      if (0x18 < in_RCX) {
        key_03[1] = in_RCX >> 4;
        temp_02[0] = (uVar1 - key_03[1]) * 0x10;
        uVar3 = in_RDI[(uVar1 - key_03[1]) * 2];
        uVar4 = (in_RDI + (uVar1 - key_03[1]) * 2)[1];
        auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),2);
        vpshufd_avx(auVar5,0xaa);
        temp_02[1] = (longlong)in_RDI;
        key_03[0] = (longlong)puVar2;
        expand_key(key_03,temp_02);
        in_RDI[uVar1 * 2] = uVar3;
        (in_RDI + uVar1 * 2)[1] = uVar4;
        uVar1 = local_38 + 2;
      }
      local_38 = uVar1;
      key_04[1] = in_RCX >> 4;
      temp_03[0] = (local_38 - key_04[1]) * 0x10;
      uVar3 = in_RDI[(local_38 - key_04[1]) * 2];
      uVar4 = (in_RDI + (local_38 - key_04[1]) * 2)[1];
      auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),4);
      vpshufd_avx(auVar5,0xff);
      temp_03[1] = (longlong)in_RDI;
      key_04[0] = (longlong)puVar2;
      expand_key(key_04,temp_03);
      in_RDI[local_38 * 2] = uVar3;
      (in_RDI + local_38 * 2)[1] = uVar4;
      uVar1 = local_38;
      if (local_38 != *(uint *)(in_RDI + 0x1e)) {
        uVar1 = local_38 + 1;
        if (0x18 < in_RCX) {
          key_05[1] = in_RCX >> 4;
          temp_04[0] = (uVar1 - key_05[1]) * 0x10;
          uVar3 = in_RDI[(uVar1 - key_05[1]) * 2];
          uVar4 = (in_RDI + (uVar1 - key_05[1]) * 2)[1];
          auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),4);
          vpshufd_avx(auVar5,0xaa);
          temp_04[1] = (longlong)in_RDI;
          key_05[0] = (longlong)puVar2;
          expand_key(key_05,temp_04);
          in_RDI[uVar1 * 2] = uVar3;
          (in_RDI + uVar1 * 2)[1] = uVar4;
          uVar1 = local_38 + 2;
        }
        local_38 = uVar1;
        key_06[1] = in_RCX >> 4;
        temp_05[0] = (local_38 - key_06[1]) * 0x10;
        uVar3 = in_RDI[(local_38 - key_06[1]) * 2];
        uVar4 = (in_RDI + (local_38 - key_06[1]) * 2)[1];
        auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),8);
        vpshufd_avx(auVar5,0xff);
        temp_05[1] = (longlong)in_RDI;
        key_06[0] = (longlong)puVar2;
        expand_key(key_06,temp_05);
        in_RDI[local_38 * 2] = uVar3;
        (in_RDI + local_38 * 2)[1] = uVar4;
        uVar1 = local_38;
        if (local_38 != *(uint *)(in_RDI + 0x1e)) {
          uVar1 = local_38 + 1;
          if (0x18 < in_RCX) {
            key_07[1] = in_RCX >> 4;
            temp_06[0] = (uVar1 - key_07[1]) * 0x10;
            uVar3 = in_RDI[(uVar1 - key_07[1]) * 2];
            uVar4 = (in_RDI + (uVar1 - key_07[1]) * 2)[1];
            auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),8);
            vpshufd_avx(auVar5,0xaa);
            temp_06[1] = (longlong)in_RDI;
            key_07[0] = (longlong)puVar2;
            expand_key(key_07,temp_06);
            in_RDI[uVar1 * 2] = uVar3;
            (in_RDI + uVar1 * 2)[1] = uVar4;
            uVar1 = local_38 + 2;
          }
          local_38 = uVar1;
          key_08[1] = in_RCX >> 4;
          temp_07[0] = (local_38 - key_08[1]) * 0x10;
          uVar3 = in_RDI[(local_38 - key_08[1]) * 2];
          uVar4 = (in_RDI + (local_38 - key_08[1]) * 2)[1];
          auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),0x10);
          vpshufd_avx(auVar5,0xff);
          temp_07[1] = (longlong)in_RDI;
          key_08[0] = (longlong)puVar2;
          expand_key(key_08,temp_07);
          in_RDI[local_38 * 2] = uVar3;
          (in_RDI + local_38 * 2)[1] = uVar4;
          uVar1 = local_38;
          if (local_38 != *(uint *)(in_RDI + 0x1e)) {
            uVar1 = local_38 + 1;
            if (0x18 < in_RCX) {
              key_09[1] = in_RCX >> 4;
              temp_08[0] = (uVar1 - key_09[1]) * 0x10;
              uVar3 = in_RDI[(uVar1 - key_09[1]) * 2];
              uVar4 = (in_RDI + (uVar1 - key_09[1]) * 2)[1];
              auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),0x10);
              vpshufd_avx(auVar5,0xaa);
              temp_08[1] = (longlong)in_RDI;
              key_09[0] = (longlong)puVar2;
              expand_key(key_09,temp_08);
              in_RDI[uVar1 * 2] = uVar3;
              (in_RDI + uVar1 * 2)[1] = uVar4;
              uVar1 = local_38 + 2;
            }
            local_38 = uVar1;
            key_10[1] = in_RCX >> 4;
            temp_09[0] = (local_38 - key_10[1]) * 0x10;
            uVar3 = in_RDI[(local_38 - key_10[1]) * 2];
            uVar4 = (in_RDI + (local_38 - key_10[1]) * 2)[1];
            auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),0x20);
            vpshufd_avx(auVar5,0xff);
            temp_09[1] = (longlong)in_RDI;
            key_10[0] = (longlong)puVar2;
            expand_key(key_10,temp_09);
            in_RDI[local_38 * 2] = uVar3;
            (in_RDI + local_38 * 2)[1] = uVar4;
            uVar1 = local_38;
            if (local_38 != *(uint *)(in_RDI + 0x1e)) {
              uVar1 = local_38 + 1;
              if (0x18 < in_RCX) {
                key_11[1] = in_RCX >> 4;
                temp_10[0] = (uVar1 - key_11[1]) * 0x10;
                uVar3 = in_RDI[(uVar1 - key_11[1]) * 2];
                uVar4 = (in_RDI + (uVar1 - key_11[1]) * 2)[1];
                auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),0x20);
                vpshufd_avx(auVar5,0xaa);
                temp_10[1] = (longlong)in_RDI;
                key_11[0] = (longlong)puVar2;
                expand_key(key_11,temp_10);
                in_RDI[uVar1 * 2] = uVar3;
                (in_RDI + uVar1 * 2)[1] = uVar4;
                uVar1 = local_38 + 2;
              }
              local_38 = uVar1;
              key_12[1] = in_RCX >> 4;
              temp_11[0] = (local_38 - key_12[1]) * 0x10;
              uVar3 = in_RDI[(local_38 - key_12[1]) * 2];
              uVar4 = (in_RDI + (local_38 - key_12[1]) * 2)[1];
              auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),0x40);
              vpshufd_avx(auVar5,0xff);
              temp_11[1] = (longlong)in_RDI;
              key_12[0] = (longlong)puVar2;
              expand_key(key_12,temp_11);
              in_RDI[local_38 * 2] = uVar3;
              (in_RDI + local_38 * 2)[1] = uVar4;
              uVar1 = local_38;
              if (local_38 != *(uint *)(in_RDI + 0x1e)) {
                uVar1 = local_38 + 1;
                if (0x18 < in_RCX) {
                  key_13[1] = in_RCX >> 4;
                  temp_12[0] = (uVar1 - key_13[1]) * 0x10;
                  uVar3 = in_RDI[(uVar1 - key_13[1]) * 2];
                  uVar4 = (in_RDI + (uVar1 - key_13[1]) * 2)[1];
                  auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),0x40);
                  vpshufd_avx(auVar5,0xaa);
                  temp_12[1] = (longlong)in_RDI;
                  key_13[0] = (longlong)puVar2;
                  expand_key(key_13,temp_12);
                  in_RDI[uVar1 * 2] = uVar3;
                  (in_RDI + uVar1 * 2)[1] = uVar4;
                  uVar1 = local_38 + 2;
                }
                local_38 = uVar1;
                key_14[1] = in_RCX >> 4;
                temp_13[0] = (local_38 - key_14[1]) * 0x10;
                uVar3 = in_RDI[(local_38 - key_14[1]) * 2];
                uVar4 = (in_RDI + (local_38 - key_14[1]) * 2)[1];
                auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),0x80);
                vpshufd_avx(auVar5,0xff);
                temp_13[1] = (longlong)in_RDI;
                key_14[0] = (longlong)puVar2;
                expand_key(key_14,temp_13);
                in_RDI[local_38 * 2] = uVar3;
                (in_RDI + local_38 * 2)[1] = uVar4;
                uVar1 = local_38;
                if (local_38 != *(uint *)(in_RDI + 0x1e)) {
                  uVar1 = local_38 + 1;
                  if (0x18 < in_RCX) {
                    key_15[1] = in_RCX >> 4;
                    temp_14[0] = (uVar1 - key_15[1]) * 0x10;
                    uVar3 = in_RDI[(uVar1 - key_15[1]) * 2];
                    uVar4 = (in_RDI + (uVar1 - key_15[1]) * 2)[1];
                    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),0x80);
                    vpshufd_avx(auVar5,0xaa);
                    temp_14[1] = (longlong)in_RDI;
                    key_15[0] = (longlong)puVar2;
                    expand_key(key_15,temp_14);
                    in_RDI[uVar1 * 2] = uVar3;
                    (in_RDI + uVar1 * 2)[1] = uVar4;
                    uVar1 = local_38 + 2;
                  }
                  local_38 = uVar1;
                  key_16[1] = in_RCX >> 4;
                  temp_15[0] = (local_38 - key_16[1]) * 0x10;
                  uVar3 = in_RDI[(local_38 - key_16[1]) * 2];
                  uVar4 = (in_RDI + (local_38 - key_16[1]) * 2)[1];
                  auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),0x1b);
                  vpshufd_avx(auVar5,0xff);
                  temp_15[1] = (longlong)in_RDI;
                  key_16[0] = (longlong)puVar2;
                  expand_key(key_16,temp_15);
                  in_RDI[local_38 * 2] = uVar3;
                  (in_RDI + local_38 * 2)[1] = uVar4;
                  uVar1 = local_38;
                  if (local_38 != *(uint *)(in_RDI + 0x1e)) {
                    uVar1 = local_38 + 1;
                    if (0x18 < in_RCX) {
                      key_17[1] = in_RCX >> 4;
                      temp_16[0] = (uVar1 - key_17[1]) * 0x10;
                      uVar3 = in_RDI[(uVar1 - key_17[1]) * 2];
                      uVar4 = (in_RDI + (uVar1 - key_17[1]) * 2)[1];
                      auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),0x1b)
                      ;
                      vpshufd_avx(auVar5,0xaa);
                      temp_16[1] = (longlong)in_RDI;
                      key_17[0] = (longlong)puVar2;
                      expand_key(key_17,temp_16);
                      in_RDI[uVar1 * 2] = uVar3;
                      (in_RDI + uVar1 * 2)[1] = uVar4;
                      uVar1 = local_38 + 2;
                    }
                    local_38 = uVar1;
                    key_18[1] = in_RCX >> 4;
                    temp_17[0] = (local_38 - key_18[1]) * 0x10;
                    uVar3 = in_RDI[(local_38 - key_18[1]) * 2];
                    uVar4 = (in_RDI + (local_38 - key_18[1]) * 2)[1];
                    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + local_38 * 2 + -2),0x36
                                            );
                    vpshufd_avx(auVar5,0xff);
                    temp_17[1] = (longlong)in_RDI;
                    key_18[0] = (longlong)puVar2;
                    expand_key(key_18,temp_17);
                    in_RDI[local_38 * 2] = uVar3;
                    (in_RDI + local_38 * 2)[1] = uVar4;
                    uVar1 = local_38;
                    if ((local_38 != *(uint *)(in_RDI + 0x1e)) &&
                       (uVar1 = local_38 + 1, 0x18 < in_RCX)) {
                      key_19[1] = in_RCX >> 4;
                      temp_18[0] = (uVar1 - key_19[1]) * 0x10;
                      uVar3 = in_RDI[(uVar1 - key_19[1]) * 2];
                      uVar4 = (in_RDI + (uVar1 - key_19[1]) * 2)[1];
                      auVar5 = aeskeygenassist(*(undefined1 (*) [16])(in_RDI + uVar1 * 2 + -2),0x36)
                      ;
                      vpshufd_avx(auVar5,0xaa);
                      temp_18[1] = (longlong)in_RDI;
                      key_19[0] = (longlong)puVar2;
                      expand_key(key_19,temp_18);
                      in_RDI[uVar1 * 2] = uVar3;
                      (in_RDI + uVar1 * 2)[1] = uVar4;
                      uVar1 = local_38 + 2;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_38 = uVar1;
  if (local_38 == *(uint *)(in_RDI + 0x1e)) {
    return;
  }
  __assert_fail("i == ctx->rounds",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/fusion.c"
                ,0x2dc,
                "void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *, int, const void *, size_t)"
               );
}

Assistant:

void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *ctx, int is_enc, const void *key, size_t key_size)
{
    assert(is_enc && "decryption is not supported (yet)");

    size_t i = 0;

    switch (key_size) {
    case 16: /* AES128 */
        ctx->rounds = 10;
        break;
    case 32: /* AES256 */
        ctx->rounds = 14;
        break;
    default:
        assert(!"invalid key size; AES128 / AES256 are supported");
        break;
    }

    ctx->keys[i++] = _mm_loadu_si128((__m128i *)key);
    if (key_size == 32)
        ctx->keys[i++] = _mm_loadu_si128((__m128i *)key + 1);

#define EXPAND(R)                                                                                                                  \
    do {                                                                                                                           \
        ctx->keys[i] = expand_key(ctx->keys[i - key_size / 16],                                                                    \
                                  _mm_shuffle_epi32(_mm_aeskeygenassist_si128(ctx->keys[i - 1], R), _MM_SHUFFLE(3, 3, 3, 3)));     \
        if (i == ctx->rounds)                                                                                                      \
            goto Done;                                                                                                             \
        ++i;                                                                                                                       \
        if (key_size > 24) {                                                                                                       \
            ctx->keys[i] = expand_key(ctx->keys[i - key_size / 16],                                                                \
                                      _mm_shuffle_epi32(_mm_aeskeygenassist_si128(ctx->keys[i - 1], R), _MM_SHUFFLE(2, 2, 2, 2))); \
            ++i;                                                                                                                   \
        }                                                                                                                          \
    } while (0)
    EXPAND(0x1);
    EXPAND(0x2);
    EXPAND(0x4);
    EXPAND(0x8);
    EXPAND(0x10);
    EXPAND(0x20);
    EXPAND(0x40);
    EXPAND(0x80);
    EXPAND(0x1b);
    EXPAND(0x36);
#undef EXPAND
Done:
    assert(i == ctx->rounds);
}